

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

void __thiscall slang::TextDiagnosticClient::TextDiagnosticClient(TextDiagnosticClient *this)

{
  FormatBuffer *__s;
  
  (this->super_DiagnosticClient).engine = (DiagnosticEngine *)0x0;
  (this->super_DiagnosticClient).sourceManager = (SourceManager *)0x0;
  (this->super_DiagnosticClient).absPaths = false;
  (this->super_DiagnosticClient)._vptr_DiagnosticClient =
       (_func_int **)&PTR__TextDiagnosticClient_0061b428;
  __s = (FormatBuffer *)operator_new(0x220);
  memset(__s,0,0x220);
  *(code **)((long)&(__s->buf).super_buffer<char> + 0x18) =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  (__s->buf).super_buffer<char>.ptr_ = (__s->buf).store_;
  *(size_t *)((long)&(__s->buf).super_buffer<char> + 0x10) = 500;
  (this->buffer)._M_t.
  super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
  super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
  super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl = __s;
  this->includeColumn = true;
  this->includeLocation = true;
  this->includeSource = true;
  this->includeOptionName = true;
  this->includeFileStack = true;
  this->includeExpansion = true;
  this->includeHierarchy = Auto;
  *(undefined4 *)&(this->super_DiagnosticClient).field_0x19 = 0x5b5b5d5a;
  *(undefined2 *)&(this->super_DiagnosticClient).field_0x1d = 0x245c;
  (this->super_DiagnosticClient).field_0x1f = 0x60;
  return;
}

Assistant:

TextDiagnosticClient::TextDiagnosticClient() : buffer(std::make_unique<FormatBuffer>()) {
    noteColor = fmt::terminal_color::bright_black;
    warningColor = fmt::terminal_color::bright_yellow;
    errorColor = fmt::terminal_color::bright_red;
    fatalColor = fmt::terminal_color::bright_red;
    highlightColor = fmt::terminal_color::bright_green;
    filenameColor = fmt::terminal_color::cyan;
    locationColor = fmt::terminal_color::bright_cyan;
}